

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

CSVFormat * csv::CSVFormat::guess_csv(void)

{
  void *pvVar1;
  CSVFormat *in_RDI;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  allocator_type local_2e;
  undefined4 local_2d;
  undefined1 local_29;
  vector<char,_std::allocator<char>_> local_28;
  
  local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0x2c;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_28;
  std::vector<char,_std::allocator<char>_>::vector
            (&in_RDI->possible_delimiters,__l,(allocator_type *)&local_2d);
  *(undefined8 *)
   ((long)&(in_RDI->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(in_RDI->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (in_RDI->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI->quote_char = '\"';
  (in_RDI->col_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->col_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(in_RDI->col_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(in_RDI->col_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_2d = 0x3b097c2c;
  local_29 = 0x5e;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_2d;
  std::vector<char,_std::allocator<char>_>::vector(&local_28,__l_00,&local_2e);
  std::vector<char,_std::allocator<char>_>::operator=(&in_RDI->possible_delimiters,&local_28);
  assert_no_char_overlap(in_RDI);
  in_RDI->no_quote = false;
  in_RDI->quote_char = '\"';
  assert_no_char_overlap(in_RDI);
  in_RDI->header = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&in_RDI->col_names
             ,0,0);
  pvVar1 = (void *)CONCAT71(local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return in_RDI;
}

Assistant:

CSV_INLINE static CSVFormat guess_csv() {
            CSVFormat format;
            format.delimiter({ ',', '|', '\t', ';', '^' })
                .quote('"')
                .header_row(0);

            return format;
        }